

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_16777232,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::InstanceIntersectorKMB<4>_>,_false>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar1;
  undefined4 uVar2;
  size_t sVar3;
  undefined1 auVar4 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar5;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  AABBNodeMB4D *node1;
  ulong uVar13;
  long lVar14;
  NodeRef *pNVar15;
  size_t sVar16;
  uint uVar17;
  size_t sVar18;
  Primitive *prim;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar19;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar20;
  undefined1 auVar21 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  vint4 ai;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  vint4 ai_1;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  vint4 ai_3;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  vint4 ai_2;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  vint4 bi;
  undefined1 auVar41 [16];
  vint4 bi_1;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  vint4 bi_3;
  undefined1 auVar44 [16];
  vint4 bi_2;
  undefined1 auVar45 [16];
  undefined1 in_ZMM11 [64];
  undefined1 auVar46 [64];
  Precalculations pre;
  undefined1 local_35b8 [16];
  vbool<4> valid0;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_34e8;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  
  stack_node[1].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (stack_node[1].ptr != 8) {
    auVar7 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar25 = vpcmpeqd_avx(auVar7,(undefined1  [16])valid_i->field_0);
    auVar22 = ZEXT816(0) << 0x40;
    auVar7 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar22,5);
    auVar8 = auVar25 & auVar7;
    if ((((auVar8 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar8 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar8 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar8[0xf] < '\0') {
      auVar4 = vandps_avx(auVar7,auVar25);
      auVar36._8_4_ = 0x7fffffff;
      auVar36._0_8_ = 0x7fffffff7fffffff;
      auVar36._12_4_ = 0x7fffffff;
      auVar7 = vandps_avx(*(undefined1 (*) [16])(ray + 0x40),auVar36);
      auVar42._8_4_ = 0x219392ef;
      auVar42._0_8_ = 0x219392ef219392ef;
      auVar42._12_4_ = 0x219392ef;
      auVar7 = vcmpps_avx(auVar7,auVar42,1);
      auVar25 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x40),auVar42,auVar7);
      auVar7 = vandps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar36);
      auVar7 = vcmpps_avx(auVar7,auVar42,1);
      auVar8 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar42,auVar7);
      auVar7 = vandps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar36);
      auVar7 = vcmpps_avx(auVar7,auVar42,1);
      auVar7 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar42,auVar7);
      auVar36 = vrcpps_avx(auVar25);
      auVar29._8_4_ = 0x3f800000;
      auVar29._0_8_ = 0x3f8000003f800000;
      auVar29._12_4_ = 0x3f800000;
      auVar26 = vfnmadd213ps_fma(auVar25,auVar36,auVar29);
      auVar42 = vrcpps_avx(auVar8);
      auVar23 = vfnmadd213ps_fma(auVar8,auVar42,auVar29);
      auVar45 = vrcpps_avx(auVar7);
      auVar29 = vfnmadd213ps_fma(auVar7,auVar45,auVar29);
      auVar7 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar22);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      aVar5.v = (__m128)vblendvps_avx(stack_near[0].field_0,auVar7,auVar4);
      auVar7 = *(undefined1 (*) [16])ray;
      auVar25 = *(undefined1 (*) [16])(ray + 0x10);
      auVar8 = vpcmpeqd_avx(in_ZMM11._0_16_,in_ZMM11._0_16_);
      local_35b8._4_4_ = auVar4._4_4_ ^ auVar8._4_4_;
      local_35b8._0_4_ = auVar4._0_4_ ^ auVar8._0_4_;
      local_35b8._8_4_ = auVar4._8_4_ ^ auVar8._8_4_;
      local_35b8._12_4_ = auVar4._12_4_ ^ auVar8._12_4_;
      auVar8 = *(undefined1 (*) [16])(ray + 0x20);
      auVar42 = vfmadd132ps_fma(auVar23,auVar42,auVar42);
      auVar22 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar22);
      auVar23._8_4_ = 0xff800000;
      auVar23._0_8_ = 0xff800000ff800000;
      auVar23._12_4_ = 0xff800000;
      auVar22 = vblendvps_avx(auVar23,auVar22,auVar4);
      auVar46 = ZEXT1664(auVar22);
      auVar22 = vfmadd132ps_fma(auVar26,auVar36,auVar36);
      auVar36 = vfmadd132ps_fma(auVar29,auVar45,auVar45);
      pNVar15 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar19 = &stack_near[2].field_0;
      stack_near[1].field_0 = aVar5;
LAB_0164a25d:
      sVar18 = pNVar15[-1].ptr;
      if (sVar18 != 0xfffffffffffffff8) {
        pNVar15 = pNVar15 + -1;
        paVar1 = paVar19 + -1;
        paVar19 = paVar19 + -1;
        auVar45 = auVar46._0_16_;
        aVar24.v = (__m128)vcmpps_avx(*paVar1,auVar45,1);
        aVar9 = *paVar1;
        if (((((undefined1  [16])aVar24 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             ((undefined1  [16])aVar24 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            ((undefined1  [16])aVar24 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            aVar24.i[3]._3_1_ < '\0') {
          do {
            uVar17 = (uint)sVar18;
            if ((sVar18 & 8) != 0) {
              if (sVar18 == 0xfffffffffffffff8) goto LAB_0164a564;
              auVar26 = vcmpps_avx(auVar45,(undefined1  [16])aVar9,6);
              if ((((auVar26 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar26 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar26 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar26[0xf] < '\0') {
                aVar20._0_8_ = local_35b8._0_8_ ^ 0xffffffffffffffff;
                aVar20._8_4_ = local_35b8._8_4_ ^ 0xffffffff;
                aVar20._12_4_ = local_35b8._12_4_ ^ 0xffffffff;
                lVar14 = (ulong)(uVar17 & 0xf) - 7;
                prim = (Primitive *)(sVar18 & 0xfffffffffffffff0);
                goto LAB_0164a4bb;
              }
              break;
            }
            uVar13 = sVar18 & 0xfffffffffffffff0;
            aVar24.i[2] = 0x7f800000;
            aVar24._0_8_ = 0x7f8000007f800000;
            aVar24.i[3] = 0x7f800000;
            sVar18 = 8;
            for (lVar14 = -0x20;
                (lVar14 != 0 && (sVar3 = *(size_t *)(uVar13 + 0x40 + lVar14 * 2), sVar3 != 8));
                lVar14 = lVar14 + 4) {
              uVar2 = *(undefined4 *)(uVar13 + 0x120 + lVar14);
              auVar30._4_4_ = uVar2;
              auVar30._0_4_ = uVar2;
              auVar30._8_4_ = uVar2;
              auVar30._12_4_ = uVar2;
              uVar2 = *(undefined4 *)(uVar13 + 0x60 + lVar14);
              auVar27._4_4_ = uVar2;
              auVar27._0_4_ = uVar2;
              auVar27._8_4_ = uVar2;
              auVar27._12_4_ = uVar2;
              auVar26 = *(undefined1 (*) [16])(ray + 0x70);
              auVar23 = vfmadd231ps_fma(auVar27,auVar26,auVar30);
              uVar2 = *(undefined4 *)(uVar13 + 0x160 + lVar14);
              auVar33._4_4_ = uVar2;
              auVar33._0_4_ = uVar2;
              auVar33._8_4_ = uVar2;
              auVar33._12_4_ = uVar2;
              uVar2 = *(undefined4 *)(uVar13 + 0xa0 + lVar14);
              auVar31._4_4_ = uVar2;
              auVar31._0_4_ = uVar2;
              auVar31._8_4_ = uVar2;
              auVar31._12_4_ = uVar2;
              auVar29 = vfmadd231ps_fma(auVar31,auVar26,auVar33);
              uVar2 = *(undefined4 *)(uVar13 + 0x1a0 + lVar14);
              auVar37._4_4_ = uVar2;
              auVar37._0_4_ = uVar2;
              auVar37._8_4_ = uVar2;
              auVar37._12_4_ = uVar2;
              uVar2 = *(undefined4 *)(uVar13 + 0xe0 + lVar14);
              auVar34._4_4_ = uVar2;
              auVar34._0_4_ = uVar2;
              auVar34._8_4_ = uVar2;
              auVar34._12_4_ = uVar2;
              auVar30 = vfmadd231ps_fma(auVar34,auVar26,auVar37);
              uVar2 = *(undefined4 *)(uVar13 + 0x140 + lVar14);
              auVar38._4_4_ = uVar2;
              auVar38._0_4_ = uVar2;
              auVar38._8_4_ = uVar2;
              auVar38._12_4_ = uVar2;
              uVar2 = *(undefined4 *)(uVar13 + 0x80 + lVar14);
              auVar41._4_4_ = uVar2;
              auVar41._0_4_ = uVar2;
              auVar41._8_4_ = uVar2;
              auVar41._12_4_ = uVar2;
              auVar31 = vfmadd231ps_fma(auVar41,auVar26,auVar38);
              uVar2 = *(undefined4 *)(uVar13 + 0x180 + lVar14);
              auVar39._4_4_ = uVar2;
              auVar39._0_4_ = uVar2;
              auVar39._8_4_ = uVar2;
              auVar39._12_4_ = uVar2;
              uVar2 = *(undefined4 *)(uVar13 + 0xc0 + lVar14);
              auVar43._4_4_ = uVar2;
              auVar43._0_4_ = uVar2;
              auVar43._8_4_ = uVar2;
              auVar43._12_4_ = uVar2;
              auVar33 = vfmadd231ps_fma(auVar43,auVar26,auVar39);
              uVar2 = *(undefined4 *)(uVar13 + 0x1c0 + lVar14);
              auVar40._4_4_ = uVar2;
              auVar40._0_4_ = uVar2;
              auVar40._8_4_ = uVar2;
              auVar40._12_4_ = uVar2;
              uVar2 = *(undefined4 *)(uVar13 + 0x100 + lVar14);
              auVar44._4_4_ = uVar2;
              auVar44._0_4_ = uVar2;
              auVar44._8_4_ = uVar2;
              auVar44._12_4_ = uVar2;
              auVar34 = vfmadd231ps_fma(auVar44,auVar26,auVar40);
              auVar12._4_4_ = auVar22._4_4_ * -auVar7._4_4_;
              auVar12._0_4_ = auVar22._0_4_ * -auVar7._0_4_;
              auVar12._8_4_ = auVar22._8_4_ * -auVar7._8_4_;
              auVar12._12_4_ = auVar22._12_4_ * -auVar7._12_4_;
              auVar21 = vfmadd213ps_fma(auVar23,auVar22,auVar12);
              auVar11._4_4_ = auVar42._4_4_ * -auVar25._4_4_;
              auVar11._0_4_ = auVar42._0_4_ * -auVar25._0_4_;
              auVar11._8_4_ = auVar42._8_4_ * -auVar25._8_4_;
              auVar11._12_4_ = auVar42._12_4_ * -auVar25._12_4_;
              auVar27 = vfmadd213ps_fma(auVar29,auVar42,auVar11);
              auVar10._4_4_ = auVar36._4_4_ * -auVar8._4_4_;
              auVar10._0_4_ = auVar36._0_4_ * -auVar8._0_4_;
              auVar10._8_4_ = auVar36._8_4_ * -auVar8._8_4_;
              auVar10._12_4_ = auVar36._12_4_ * -auVar8._12_4_;
              auVar30 = vfmadd213ps_fma(auVar30,auVar36,auVar10);
              auVar31 = vfmadd213ps_fma(auVar31,auVar22,auVar12);
              auVar33 = vfmadd213ps_fma(auVar33,auVar42,auVar11);
              auVar34 = vfmadd213ps_fma(auVar34,auVar36,auVar10);
              auVar23 = vpminsd_avx(auVar21,auVar31);
              auVar29 = vpminsd_avx(auVar27,auVar33);
              auVar23 = vpmaxsd_avx(auVar23,auVar29);
              auVar29 = vpminsd_avx(auVar30,auVar34);
              auVar23 = vpmaxsd_avx(auVar23,auVar29);
              auVar29 = vpmaxsd_avx(auVar21,auVar31);
              auVar21 = vpmaxsd_avx(auVar27,auVar33);
              auVar21 = vpminsd_avx(auVar29,auVar21);
              auVar29 = vpmaxsd_avx(auVar30,auVar34);
              auVar29 = vpminsd_avx(auVar29,auVar45);
              auVar21 = vpminsd_avx(auVar21,auVar29);
              auVar29 = vpmaxsd_avx(auVar23,(undefined1  [16])aVar5);
              if ((uVar17 & 7) == 6) {
                auVar29 = vcmpps_avx(auVar29,auVar21,2);
                uVar2 = *(undefined4 *)(uVar13 + 0x1e0 + lVar14);
                auVar32._4_4_ = uVar2;
                auVar32._0_4_ = uVar2;
                auVar32._8_4_ = uVar2;
                auVar32._12_4_ = uVar2;
                auVar21 = vcmpps_avx(auVar32,auVar26,2);
                uVar2 = *(undefined4 *)(uVar13 + 0x200 + lVar14);
                auVar35._4_4_ = uVar2;
                auVar35._0_4_ = uVar2;
                auVar35._8_4_ = uVar2;
                auVar35._12_4_ = uVar2;
                auVar26 = vcmpps_avx(auVar26,auVar35,1);
                auVar26 = vandps_avx(auVar21,auVar26);
                auVar26 = vandps_avx(auVar26,auVar29);
              }
              else {
                auVar26 = vcmpps_avx(auVar29,auVar21,2);
              }
              auVar29 = vcmpps_avx(auVar45,(undefined1  [16])aVar9,6);
              auVar26 = vandps_avx(auVar26,auVar29);
              auVar26 = vpslld_avx(auVar26,0x1f);
              sVar16 = sVar18;
              aVar6 = aVar24;
              if (((((auVar26 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                    (auVar26 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar26 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   auVar26[0xf] < '\0') &&
                 (auVar28._8_4_ = 0x7f800000, auVar28._0_8_ = 0x7f8000007f800000,
                 auVar28._12_4_ = 0x7f800000,
                 aVar6 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                         vblendvps_avx(auVar28,auVar23,auVar26), sVar16 = sVar3, sVar18 != 8)) {
                pNVar15->ptr = sVar18;
                pNVar15 = pNVar15 + 1;
                *paVar19 = aVar24;
                paVar19 = paVar19 + 1;
              }
              aVar24 = aVar6;
              sVar18 = sVar16;
            }
            aVar9 = aVar24;
          } while (sVar18 != 8);
        }
        goto LAB_0164a25d;
      }
LAB_0164a564:
      auVar7 = vandps_avx(local_35b8,auVar4);
      auVar25._8_4_ = 0xff800000;
      auVar25._0_8_ = 0xff800000ff800000;
      auVar25._12_4_ = 0xff800000;
      auVar7 = vmaskmovps_avx(auVar7,auVar25);
      *(undefined1 (*) [16])(ray + 0x80) = auVar7;
    }
  }
  return;
  while( true ) {
    valid0.field_0 = aVar20;
    InstanceIntersectorKMB<4>::occluded
              ((InstanceIntersectorKMB<4> *)&local_34e8,&valid0,&pre,ray,context,prim);
    aVar20.v = (__m128)vandnps_avx(local_34e8.v,valid0.field_0);
    auVar26 = (undefined1  [16])valid0.field_0 & ~(undefined1  [16])local_34e8;
    prim = prim + 1;
    aVar24 = local_34e8;
    if ((((auVar26 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar26 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar26 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar26[0xf])
    break;
LAB_0164a4bb:
    lVar14 = lVar14 + -1;
    if (lVar14 == 0) break;
  }
  auVar26 = vpcmpeqd_avx((undefined1  [16])aVar24,(undefined1  [16])aVar24);
  auVar21._0_4_ = aVar20.i[0] ^ auVar26._0_4_;
  auVar21._4_4_ = aVar20.i[1] ^ auVar26._4_4_;
  auVar21._8_4_ = aVar20.i[2] ^ auVar26._8_4_;
  auVar21._12_4_ = aVar20.i[3] ^ auVar26._12_4_;
  local_35b8 = vorps_avx(local_35b8,auVar21);
  auVar26 = auVar26 & ~local_35b8;
  if ((((auVar26 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar26 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar26 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar26[0xf])
  goto LAB_0164a564;
  auVar26._8_4_ = 0xff800000;
  auVar26._0_8_ = 0xff800000ff800000;
  auVar26._12_4_ = 0xff800000;
  auVar45 = vblendvps_avx(auVar45,auVar26,local_35b8);
  auVar46 = ZEXT1664(auVar45);
  goto LAB_0164a25d;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }